

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4faa5c::Db::parseIntegerLiteral(Db *this,StringView Lit)

{
  char *pcVar1;
  Node *pNVar2;
  Node NVar3;
  
  NVar3 = (Node)parseNumber(this,true);
  if (((NVar3._vptr_Node == NVar3._8_8_) || (pcVar1 = this->First, pcVar1 == this->Last)) ||
     (*pcVar1 != 'E')) {
    pNVar2 = (Node *)0x0;
  }
  else {
    this->First = pcVar1 + 1;
    pNVar2 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x30);
    pNVar2->K = KExpr;
    pNVar2->RHSComponentCache = No;
    pNVar2->ArrayCache = No;
    pNVar2->FunctionCache = No;
    pNVar2->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0022e7e0;
    pNVar2[1]._vptr_Node = (_func_int **)Lit.First;
    *(char **)&pNVar2[1].K = Lit.Last;
    pNVar2[2] = NVar3;
  }
  return pNVar2;
}

Assistant:

Node *Db::parseIntegerLiteral(StringView Lit) {
  StringView Tmp = parseNumber(true);
  if (!Tmp.empty() && consumeIf('E'))
    return make<IntegerExpr>(Lit, Tmp);
  return nullptr;
}